

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_submodule *
lys_sub_parse_mem(lys_module *module,char *data,LYS_INFORMAT format,unres_schema *unres)

{
  size_t sVar1;
  char *__dest;
  lys_submodule *plVar2;
  LY_ERR *pLVar3;
  
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x440,
                  "struct lys_submodule *lys_sub_parse_mem(struct lys_module *, const char *, LYS_INFORMAT, struct unres_schema *)"
                 );
  }
  if (data != (char *)0x0) {
    if (format == LYS_IN_YANG) {
      sVar1 = strlen(data);
      __dest = (char *)malloc((ulong)((int)sVar1 + 2));
      if (__dest == (char *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_sub_parse_mem");
        return (lys_submodule *)0x0;
      }
      memcpy(__dest,data,sVar1 & 0xffffffff);
      __dest[(int)sVar1 + 1] = '\0';
      __dest[sVar1 & 0xffffffff] = '\0';
      data = __dest;
    }
    else {
      __dest = (char *)0x0;
    }
    if ((module->field_0x40 & 1) != 0) {
      module = (lys_module *)module->data;
    }
    if (format == LYS_IN_YANG) {
      plVar2 = yang_read_submodule(module,data,0,unres);
    }
    else {
      if (format != LYS_IN_YIN) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                      ,0x45b,
                      "struct lys_submodule *lys_sub_parse_mem(struct lys_module *, const char *, LYS_INFORMAT, struct unres_schema *)"
                     );
      }
      plVar2 = yin_read_submodule(module,data,unres);
    }
    free(__dest);
    return plVar2;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0x441,
                "struct lys_submodule *lys_sub_parse_mem(struct lys_module *, const char *, LYS_INFORMAT, struct unres_schema *)"
               );
}

Assistant:

struct lys_submodule *
lys_sub_parse_mem(struct lys_module *module, const char *data, LYS_INFORMAT format, struct unres_schema *unres)
{
    char *enlarged_data = NULL;
    struct lys_submodule *submod = NULL;
    unsigned int len;

    assert(module);
    assert(data);

    if (format == LYS_IN_YANG) {
        /* enlarge data by 2 bytes for flex */
        len = strlen(data);
        enlarged_data = malloc((len + 2) * sizeof *enlarged_data);
        if (!enlarged_data) {
            LOGMEM;
            return NULL;
        }
        memcpy(enlarged_data, data, len);
        enlarged_data[len] = enlarged_data[len + 1] = '\0';
        data = enlarged_data;
    }

    /* get the main module */
    module = lys_main_module(module);

    switch (format) {
    case LYS_IN_YIN:
        submod = yin_read_submodule(module, data, unres);
        break;
    case LYS_IN_YANG:
        submod = yang_read_submodule(module, data, 0, unres);
        break;
    default:
        assert(0);
        break;
    }

    free(enlarged_data);
    return submod;
}